

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void hta::
     throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
               (char *args,duration<long,_std::ratio<1L,_1000000000L>_> args_1)

{
  runtime_error *this;
  stringstream msg;
  make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  amStack_1c8 [32];
  stringstream local_1a8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  detail::make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::
  operator()(amStack_1c8,(stringstream *)local_1a8,args,args_1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)amStack_1c8);
  *(undefined ***)this = &PTR__runtime_error_00120aa0;
  __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}